

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicohandler.cpp
# Opt level: O2

void __thiscall ICOReader::read8BitBMP(ICOReader *this,QImage *image)

{
  QIODevice *pQVar1;
  long lVar2;
  longlong lVar3;
  long lVar4;
  int iVar5;
  long in_FS_OFFSET;
  QImage aQStack_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->iod != (QIODevice *)0x0) {
    iVar5 = (this->icoAttrib).h;
    lVar2 = QImage::bytesPerLine();
    do {
      if (iVar5 < 1) goto LAB_001045b4;
      iVar5 = iVar5 + -1;
      pQVar1 = this->iod;
      lVar3 = QImage::scanLine((int)image);
      lVar4 = QIODevice::read((char *)pQVar1,lVar3);
    } while (lVar4 == lVar2);
  }
  QImage::QImage(aQStack_48);
  QImage::operator=(image,aQStack_48);
  QImage::~QImage(aQStack_48);
LAB_001045b4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ICOReader::read8BitBMP(QImage & image)
{
    if (iod) {

        int h = icoAttrib.h;
        qsizetype bpl = image.bytesPerLine();

        while (--h >= 0) {
            if (iod->read((char *)image.scanLine(h), bpl) != bpl) {
                image = QImage();
                break;
            }
        }
    } else {
        image = QImage();
    }
}